

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

int mqc_restart_enc(opj_mqc_t *mqc)

{
  int iVar1;
  
  iVar1 = 0xc;
  do {
    iVar1 = iVar1 - mqc->ct;
    mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
    mqc_byteout(mqc);
  } while (0 < iVar1);
  return 1;
}

Assistant:

int mqc_restart_enc(opj_mqc_t *mqc) {
	int correction = 1;
	
	/* <flush part> */
	int n = 27 - 15 - mqc->ct;
	mqc->c <<= mqc->ct;
	while (n > 0) {
		mqc_byteout(mqc);
		n -= mqc->ct;
		mqc->c <<= mqc->ct;
	}
	mqc_byteout(mqc);
	
	return correction;
}